

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Input * __thiscall helics::ValueFederate::getInput(ValueFederate *this,string_view name)

{
  string_view addition;
  string_view key;
  string_view key_00;
  bool bVar1;
  Input *pIVar2;
  pointer this_00;
  size_t in_RDX;
  ValueFederateManager *in_RSI;
  Input *inp;
  char *in_stack_ffffffffffffff98;
  char *in_stack_fffffffffffffff8;
  
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x28e9f5);
  key._M_str = in_stack_fffffffffffffff8;
  key._M_len = in_RDX;
  pIVar2 = ValueFederateManager::getInput(in_RSI,key);
  bVar1 = Interface::isValid((Interface *)0x28ea36);
  if (!bVar1) {
    this_00 = std::
              unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
              ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                            *)0x28ea4c);
    addition._M_str = in_stack_ffffffffffffff98;
    addition._M_len = in_RDX;
    Federate::localNameGenerator_abi_cxx11_((Federate *)in_RSI,addition);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    key_00._M_str = in_stack_fffffffffffffff8;
    key_00._M_len = in_RDX;
    pIVar2 = ValueFederateManager::getInput(in_RSI,key_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return pIVar2;
}

Assistant:

const Input& ValueFederate::getInput(std::string_view name) const
{
    auto& inp = vfManager->getInput(name);
    if (!inp.isValid()) {
        return vfManager->getInput(localNameGenerator(name));
    }
    return inp;
}